

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

int secp256k1_clz64_var(uint64_t x)

{
  int iVar1;
  
  if (x == 0) {
    iVar1 = 0x40;
  }
  else {
    iVar1 = 0;
    for (; -1 < (long)x; x = x * 2) {
      iVar1 = iVar1 + 1;
    }
  }
  return iVar1;
}

Assistant:

SECP256K1_INLINE static int secp256k1_clz64_var(uint64_t x) {
    int ret;
    if (!x) {
        return 64;
    }
# if defined(HAVE_BUILTIN_CLZLL)
    ret = __builtin_clzll(x);
# else
    /*FIXME: debruijn fallback. */
    for (ret = 0; ((x & (1ULL << 63)) == 0); x <<= 1, ret++);
# endif
    return ret;
}